

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

string * __thiscall
NTrodeObj::getPrintStr_abi_cxx11_(string *__return_storage_ptr__,NTrodeObj *this,int indent)

{
  string *psVar1;
  ostream *poVar2;
  reference pvVar3;
  int iVar4;
  int iVar5;
  int i;
  size_type __n;
  bool bVar6;
  string indentStr;
  ostringstream oss;
  allocator local_1d1;
  string *local_1d0;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::string::string(local_1c8,"    ",&local_1d1);
  iVar4 = 0;
  if (0 < indent) {
    iVar4 = indent;
  }
  iVar5 = iVar4;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    std::operator<<((ostream *)local_1a8,local_1c8);
  }
  std::operator<<((ostream *)local_1a8,"Printing \'NTrodeObj\'\n");
  iVar5 = iVar4;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    std::operator<<((ostream *)local_1a8,local_1c8);
  }
  poVar2 = std::operator<<((ostream *)local_1a8,"    -id : ");
  poVar2 = std::operator<<(poVar2,(string *)&this->id);
  std::operator<<(poVar2,"\n");
  iVar5 = iVar4;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    std::operator<<((ostream *)local_1a8,local_1c8);
  }
  poVar2 = std::operator<<((ostream *)local_1a8,"    -hw_chans vector size[");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"]:\n");
  local_1d0 = __return_storage_ptr__;
  for (__n = 0; psVar1 = local_1d0, iVar5 = iVar4,
      (long)__n <
      (long)(int)((ulong)((long)(this->hw_chans).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->hw_chans).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2); __n = __n + 1) {
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      std::operator<<((ostream *)local_1a8,local_1c8);
    }
    poVar2 = std::operator<<((ostream *)local_1a8,"        - i[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)__n);
    poVar2 = std::operator<<(poVar2,"] : ");
    pvVar3 = std::vector<int,_std::allocator<int>_>::at(&this->hw_chans,__n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar3);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return psVar1;
}

Assistant:

std::string NTrodeObj::getPrintStr(int indent) {
    std::ostringstream oss;
    std::string indentStr = "    ";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "Printing 'NTrodeObj'\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -id : " << id << "\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -hw_chans vector size[" << hw_chans.size() << "]:\n";
    for (int i = 0; i < (int)hw_chans.size(); i++) {
        for (int k = 0; k < indent; k++) { oss << indentStr; }
        oss << "        - i[" << i << "] : " << hw_chans.at(i) << "\n";
    }
    return(oss.str());
}